

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::cmCTest(cmCTest *this)

{
  mapped_type mVar1;
  bool bVar2;
  Private *this_00;
  pointer pPVar3;
  pointer pPVar4;
  string *s;
  mapped_type *pmVar5;
  reference ppcVar6;
  cmCTestGenericHandler **handler;
  iterator __end1;
  iterator __begin1;
  vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *__range1;
  mapped_type local_220;
  allocator<char> local_219;
  Part p;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string envValue;
  cmCTest *this_local;
  
  this_00 = (Private *)operator_new(0x23d8);
  Private::Private(this_00);
  std::unique_ptr<cmCTest::Private,std::default_delete<cmCTest::Private>>::
  unique_ptr<std::default_delete<cmCTest::Private>,void>
            ((unique_ptr<cmCTest::Private,std::default_delete<cmCTest::Private>> *)this,this_00);
  std::__cxx11::string::string((string *)local_40);
  bVar2 = cmsys::SystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE",(string *)local_40);
  if (bVar2) {
    bVar2 = cmSystemTools::IsOff((string *)local_40);
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar3->OutputTestOutputOnTestFailure = (bool)((bVar2 ^ 0xffU) & 1);
  }
  std::__cxx11::string::clear();
  bVar2 = cmsys::SystemTools::GetEnv("CTEST_PROGRESS_OUTPUT",(string *)local_40);
  if (bVar2) {
    bVar2 = cmSystemTools::IsOff((string *)local_40);
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar3->TestProgressOutput = (bool)((bVar2 ^ 0xffU) & 1);
  }
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Start",&local_61);
  Private::PartInfo::SetName(pPVar3->Parts,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Update",&local_89);
  Private::PartInfo::SetName(pPVar3->Parts + 1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Configure",&local_b1);
  Private::PartInfo::SetName(pPVar3->Parts + 2,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Build",&local_d9);
  Private::PartInfo::SetName(pPVar3->Parts + 3,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Test",&local_101);
  Private::PartInfo::SetName(pPVar3->Parts + 4,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"Coverage",&local_129);
  Private::PartInfo::SetName(pPVar3->Parts + 5,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"MemCheck",&local_151);
  Private::PartInfo::SetName(pPVar3->Parts + 6,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"Submit",&local_179);
  Private::PartInfo::SetName(pPVar3->Parts + 7,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"Notes",&local_1a1);
  Private::PartInfo::SetName(pPVar3->Parts + 8,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"ExtraFiles",&local_1c9);
  Private::PartInfo::SetName(pPVar3->Parts + 9,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Upload",&local_1f1);
  Private::PartInfo::SetName(pPVar3->Parts + 10,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&p,"Done",&local_219);
  Private::PartInfo::SetName(pPVar3->Parts + 0xb,(string *)&p);
  std::__cxx11::string::~string((string *)&p);
  std::allocator<char>::~allocator(&local_219);
  for (local_220 = PartStart; mVar1 = local_220, local_220 != PartCount;
      local_220 = local_220 + PartUpdate) {
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    s = Private::PartInfo::GetName_abi_cxx11_(pPVar4->Parts + local_220);
    cmsys::SystemTools::LowerCase((string *)&__range1,s);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>_>
             ::operator[](&pPVar3->PartMap,(key_type *)&__range1);
    *pmVar5 = mVar1;
    std::__cxx11::string::~string((string *)&__range1);
  }
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  Private::GetTestingHandlers
            ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)&__begin1,
             pPVar3);
  __end1 = std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::begin
                     ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                      &__begin1);
  handler = (cmCTestGenericHandler **)
            std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::end
                      ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                       &__begin1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
                                     *)&handler), bVar2) {
    ppcVar6 = __gnu_cxx::
              __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
              ::operator*(&__end1);
    cmCTestGenericHandler::SetCTestInstance(*ppcVar6,this);
    __gnu_cxx::
    __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::~vector
            ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)&__begin1)
  ;
  cmSystemTools::EnableVSConsoleOutput();
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

cmCTest::cmCTest()
  : Impl(new Private)
{
  std::string envValue;
  if (cmSystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE", envValue)) {
    this->Impl->OutputTestOutputOnTestFailure =
      !cmSystemTools::IsOff(envValue);
  }
  envValue.clear();
  if (cmSystemTools::GetEnv("CTEST_PROGRESS_OUTPUT", envValue)) {
    this->Impl->TestProgressOutput = !cmSystemTools::IsOff(envValue);
  }

  this->Impl->Parts[PartStart].SetName("Start");
  this->Impl->Parts[PartUpdate].SetName("Update");
  this->Impl->Parts[PartConfigure].SetName("Configure");
  this->Impl->Parts[PartBuild].SetName("Build");
  this->Impl->Parts[PartTest].SetName("Test");
  this->Impl->Parts[PartCoverage].SetName("Coverage");
  this->Impl->Parts[PartMemCheck].SetName("MemCheck");
  this->Impl->Parts[PartSubmit].SetName("Submit");
  this->Impl->Parts[PartNotes].SetName("Notes");
  this->Impl->Parts[PartExtraFiles].SetName("ExtraFiles");
  this->Impl->Parts[PartUpload].SetName("Upload");
  this->Impl->Parts[PartDone].SetName("Done");

  // Fill the part name-to-id map.
  for (Part p = PartStart; p != PartCount; p = Part(p + 1)) {
    this->Impl
      ->PartMap[cmSystemTools::LowerCase(this->Impl->Parts[p].GetName())] = p;
  }

  for (auto& handler : this->Impl->GetTestingHandlers()) {
    handler->SetCTestInstance(this);
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();
}